

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateRegistrationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *in_RDX;
  string_view text;
  string local_38;
  
  UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_38,(java *)this->descriptor_,in_RDX);
  text._M_str = "registry.add($scope$.$name$);\n";
  text._M_len = 0x1e;
  io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,text,(char (*) [6])0x106645f,&this->scope_,(char (*) [5])0xd8d1e3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return 7;
}

Assistant:

int ImmutableExtensionGenerator::GenerateRegistrationCode(
    io::Printer* printer) {
  printer->Print("registry.add($scope$.$name$);\n", "scope", scope_, "name",
                 UnderscoresToCamelCaseCheckReserved(descriptor_));
  return 7;
}